

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

uint32_t helper_float_floor_2008_w_d_mips(CPUMIPSState *env,uint64_t fdt0)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uintptr_t unaff_retaddr;
  
  (env->active_fpu).fp_status.float_rounding_mode = '\x01';
  uVar1 = float64_to_int32_mips(fdt0,&(env->active_fpu).fp_status);
  (env->active_fpu).fp_status.float_rounding_mode = (char)ieee_rm_mips[(env->active_fpu).fcr31 & 3];
  uVar2 = 0;
  if ((fdt0 & 0x7fffffffffffffff) < 0x7ff0000000000001) {
    uVar2 = uVar1;
  }
  if (((env->active_fpu).fp_status.float_exception_flags & 1) != 0) {
    uVar1 = uVar2;
  }
  update_fcr31(env,unaff_retaddr);
  return uVar1;
}

Assistant:

uint32_t helper_float_floor_2008_w_d(CPUMIPSState *env, uint64_t fdt0)
{
    uint32_t wt2;

    set_float_rounding_mode(float_round_down, &env->active_fpu.fp_status);
    wt2 = float64_to_int32(fdt0, &env->active_fpu.fp_status);
    restore_rounding_mode(env);
    if (get_float_exception_flags(&env->active_fpu.fp_status)
            & float_flag_invalid) {
        if (float64_is_any_nan(fdt0)) {
            wt2 = 0;
        }
    }
    update_fcr31(env, GETPC());
    return wt2;
}